

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_source_layered.c
# Opt level: O0

zip_source_t *
zip_source_layered_create
          (zip_source_t *src,zip_source_layered_callback cb,void *ud,zip_error_t *error)

{
  long lVar1;
  zip_int64_t supports;
  zip_int64_t lower_supports;
  zip_source_t *zs;
  zip_error_t *error_local;
  void *ud_local;
  zip_source_layered_callback cb_local;
  zip_source_t *src_local;
  
  zs = (zip_source_t *)error;
  error_local = (zip_error_t *)ud;
  ud_local = cb;
  cb_local = (zip_source_layered_callback)src;
  supports = zip_source_supports(src);
  lVar1 = (*(code *)ud_local)(cb_local,error_local,&supports,8,0xe);
  if (lVar1 < 0) {
    zip_error_set((zip_error_t *)zs,0x12,0);
    (*(code *)ud_local)(cb_local,error_local,zs,0x10,4);
    src_local = (zip_source_t *)0x0;
  }
  else {
    src_local = _zip_source_new((zip_error_t *)zs);
    if (src_local == (zip_source_t *)0x0) {
      src_local = (zip_source_t *)0x0;
    }
    else {
      src_local->src = (zip_source_t *)cb_local;
      (src_local->cb).f = (zip_source_callback)ud_local;
      src_local->ud = error_local;
      src_local->supports = lVar1;
      src_local->supports = src_local->supports & 0xffffffffffff40ff;
    }
  }
  return src_local;
}

Assistant:

zip_source_t *
zip_source_layered_create(zip_source_t *src, zip_source_layered_callback cb, void *ud, zip_error_t *error) {
    zip_source_t *zs;
    zip_int64_t lower_supports, supports;

    lower_supports = zip_source_supports(src);
    supports = cb(src, ud, &lower_supports, sizeof(lower_supports), ZIP_SOURCE_SUPPORTS);
    if (supports < 0) {
        zip_error_set(error,ZIP_ER_INVAL, 0); /* Initialize in case cb doesn't return valid error. */
        cb(src, ud, error, sizeof(*error), ZIP_SOURCE_ERROR);
        return NULL;
    }

    if ((zs = _zip_source_new(error)) == NULL) {
        return NULL;
    }

    zs->src = src;
    zs->cb.l = cb;
    zs->ud = ud;
    zs->supports = supports;

    /* Layered sources can't support writing, since we currently have no use case. If we want to revisit this, we have to define how the two sources interact. */
    zs->supports &= ~(ZIP_SOURCE_SUPPORTS_WRITABLE & ~ZIP_SOURCE_SUPPORTS_SEEKABLE);

    return zs;
}